

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O1

double __thiscall libDAI::TFactor<double>::log(TFactor<double> *this,double __x)

{
  TFactor<double> *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar1;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  TProb<double> local_30;
  
  TFactor(this);
  dVar1 = extraout_XMM0_Qa;
  if (this != in_RSI) {
    std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::operator=
              ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)this,
               (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)in_RSI);
    (this->_vs)._statespace = (in_RSI->_vs)._statespace;
    dVar1 = extraout_XMM0_Qa_00;
  }
  dVar1 = TProb<double>::log(&local_30,dVar1);
  if (&this->_p != &local_30) {
    std::vector<double,_std::allocator<double>_>::operator=(&(this->_p)._p,&local_30._p);
    dVar1 = extraout_XMM0_Qa_01;
  }
  if (local_30._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    dVar1 = extraout_XMM0_Qa_02;
  }
  return dVar1;
}

Assistant:

TFactor<T> log() const {
                TFactor<T> l; 
                l._vs = _vs; 
                l._p = _p.log(); 
                return l; 
            }